

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall
QUrlPrivate::setUserInfo<QStringView>(QUrlPrivate *this,QStringView *value,ParsingMode mode)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QStringView local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QStringView::indexOf(value,(QChar)0x3a,0,CaseSensitive);
  if (qVar1 < 0) {
    setUserName<QStringView>(this,value,mode);
    QString::clear(&this->password);
    this->sectionIsPresent = this->sectionIsPresent & 0xfb;
  }
  else {
    local_40.m_data = value->m_data;
    local_40.m_size = qVar1;
    setUserName<QStringView>(this,&local_40,mode);
    local_40.m_data = value->m_data + qVar1 + 1;
    local_40.m_size = value->m_size - (qVar1 + 1);
    setPassword<QStringView>(this,&local_40,mode);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlPrivate::setUserInfo(String &&value, QUrl::ParsingMode mode)
{
    Q_ASSERT_X(mode != QUrl::DecodedMode, "setUserInfo",
               "This function should only be called when parsing encoded components");
    qsizetype delimIndex = value.indexOf(u':');
    if (delimIndex < 0) {
        // no password
        setUserName(std::move(value), mode);
        password.clear();
        sectionIsPresent &= ~Password;
    } else {
        setUserName(value.first(delimIndex), mode);
        setPassword(value.sliced(delimIndex + 1), mode);
    }
}